

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void ReportHeader(lemon *lemp)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char pattern [1000];
  char line [1000];
  
  pcVar6 = "";
  if (lemp->tokenprefix != (char *)0x0) {
    pcVar6 = lemp->tokenprefix;
  }
  pFVar2 = (FILE *)file_open(lemp,".h","rb");
  if (pFVar2 != (FILE *)0x0) {
    uVar5 = 1;
    do {
      iVar4 = (int)uVar5;
      if (((long)lemp->nterminal <= (long)uVar5) ||
         (pcVar3 = fgets(line,1000,pFVar2), pcVar3 == (char *)0x0)) break;
      lemon_sprintf(pattern,"#define %s%-30s %3d\n",pcVar6,lemp->symbols[uVar5]->name,
                    uVar5 & 0xffffffff);
      iVar1 = strcmp(line,pattern);
      uVar5 = uVar5 + 1;
    } while (iVar1 == 0);
    iVar1 = fgetc(pFVar2);
    fclose(pFVar2);
    if ((iVar1 == -1) && (lemp->nterminal == iVar4)) {
      return;
    }
  }
  pFVar2 = (FILE *)file_open(lemp,".h","wb");
  if (pFVar2 != (FILE *)0x0) {
    for (uVar5 = 1; (long)uVar5 < (long)lemp->nterminal; uVar5 = uVar5 + 1) {
      fprintf(pFVar2,"#define %s%-30s %3d\n",pcVar6,lemp->symbols[uVar5]->name,uVar5 & 0xffffffff);
    }
    fclose(pFVar2);
  }
  return;
}

Assistant:

void ReportHeader(struct lemon *lemp)
{
  FILE *out, *in;
  const char *prefix;
  char line[LINESIZE];
  char pattern[LINESIZE];
  int i;

  if( lemp->tokenprefix ) prefix = lemp->tokenprefix;
  else                    prefix = "";
  in = file_open(lemp,".h","rb");
  if( in ){
    int nextChar;
    for(i=1; i<lemp->nterminal && fgets(line,LINESIZE,in); i++){
      lemon_sprintf(pattern,"#define %s%-30s %3d\n",
                    prefix,lemp->symbols[i]->name,i);
      if( strcmp(line,pattern) ) break;
    }
    nextChar = fgetc(in);
    fclose(in);
    if( i==lemp->nterminal && nextChar==EOF ){
      /* No change in the file.  Don't rewrite it. */
      return;
    }
  }
  out = file_open(lemp,".h","wb");
  if( out ){
    for(i=1; i<lemp->nterminal; i++){
      fprintf(out,"#define %s%-30s %3d\n",prefix,lemp->symbols[i]->name,i);
    }
    fclose(out);
  }
  return;
}